

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writeDeepTiledFile.cpp
# Opt level: O2

void writeDeepTiledFile(char *filename,Box2i *displayWindow,Box2i *dataWindow,int tileSizeX,
                       int tileSizeY)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  undefined4 *puVar6;
  int j;
  int i;
  int iVar7;
  long lVar8;
  int j_1;
  long lVar9;
  long lVar10;
  long lVar11;
  int local_188;
  int local_180;
  DeepTiledOutputFile file;
  Array2D<Imath_3_2::half_*> dataA;
  Array2D<float_*> dataZ;
  Array2D<unsigned_int> sampleCount;
  Header header;
  DeepFrameBuffer frameBuffer;
  Slice local_68 [56];
  
  iVar2 = (dataWindow->max).y;
  iVar3 = (dataWindow->min).y;
  iVar7 = (dataWindow->max).x;
  iVar4 = (dataWindow->min).x;
  frameBuffer._map._M_t._M_impl._0_8_ = 0;
  Imf_3_4::Header::Header((Header *)0x3f800000,0x3f800000,&header);
  pcVar5 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel((Channel *)&frameBuffer,FLOAT,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar5,(Channel *)0x10a114);
  pcVar5 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel((Channel *)&frameBuffer,HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar5,(Channel *)0x10a11a);
  Imf_3_4::Header::setType((string *)&header);
  puVar6 = (undefined4 *)Imf_3_4::Header::compression();
  *puVar6 = 2;
  frameBuffer._map._M_t._M_impl._4_4_ = tileSizeY;
  frameBuffer._map._M_t._M_impl._0_4_ = tileSizeX;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  Imf_3_4::Header::setTileDescription((TileDescription *)&header);
  lVar10 = (long)iVar2 - (long)iVar3;
  lVar8 = lVar10 + 1;
  lVar9 = (long)iVar7 - (long)iVar4;
  lVar11 = lVar9 + 1;
  dataZ._sizeX = 0;
  dataZ._sizeY = 0;
  dataZ._data = (float **)0x0;
  Imf_3_4::Array2D<float_*>::resizeErase(&dataZ,lVar8,lVar11);
  dataA._sizeX = 0;
  dataA._sizeY = 0;
  dataA._data = (half **)0x0;
  Imf_3_4::Array2D<Imath_3_2::half_*>::resizeErase(&dataA,lVar8,lVar11);
  sampleCount._sizeX = 0;
  sampleCount._sizeY = 0;
  sampleCount._data = (uint *)0x0;
  Imf_3_4::Array2D<unsigned_int>::resizeErase(&sampleCount,lVar8,lVar11);
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::DeepTiledOutputFile::DeepTiledOutputFile(&file,filename,&header,iVar2);
  Imf_3_4::DeepFrameBuffer::DeepFrameBuffer(&frameBuffer);
  lVar8 = (long)(int)lVar11;
  Imf_3_4::Slice::Slice
            (local_68,UINT,
             (char *)(sampleCount._data + (-(long)(dataWindow->min).x - (dataWindow->min).y * lVar8)
                     ),4,lVar11 * 4,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
  Imf_3_4::DeepSlice::DeepSlice
            ((DeepSlice *)local_68,FLOAT,
             (char *)(dataZ._data + (-(long)(dataWindow->min).x - (dataWindow->min).y * lVar8)),8,
             lVar11 * 8,4,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insert((char *)&frameBuffer,(DeepSlice *)0x10a114);
  Imf_3_4::DeepSlice::DeepSlice
            ((DeepSlice *)local_68,HALF,
             (char *)(dataA._data + (-(long)(dataWindow->min).x - (dataWindow->min).y * lVar8)),8,
             lVar11 * 8,2,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insert((char *)&frameBuffer,(DeepSlice *)0x10a11a);
  Imf_3_4::DeepTiledOutputFile::setFrameBuffer((DeepFrameBuffer *)&file);
  iVar2 = 0;
  while( true ) {
    iVar7 = (int)&file;
    iVar3 = Imf_3_4::DeepTiledOutputFile::numYTiles(iVar7);
    if (iVar3 <= iVar2) break;
    iVar3 = 0;
    while( true ) {
      iVar4 = Imf_3_4::DeepTiledOutputFile::numXTiles(iVar7);
      if (iVar4 <= iVar3) break;
      Imf_3_4::DeepTiledOutputFile::writeTile(iVar7,iVar3,iVar2);
      iVar3 = iVar3 + 1;
    }
    iVar2 = iVar2 + 1;
  }
  local_180 = (int)lVar9;
  local_188 = (int)lVar10;
  lVar11 = 0;
  for (lVar8 = 0; lVar8 <= local_188; lVar8 = lVar8 + 1) {
    for (lVar9 = 0; lVar9 <= local_180; lVar9 = lVar9 + 1) {
      pvVar1 = *(void **)((long)dataZ._data + lVar9 * 8 + dataZ._sizeY * lVar11);
      if (pvVar1 != (void *)0x0) {
        operator_delete__(pvVar1);
      }
      pvVar1 = *(void **)((long)dataA._data + lVar9 * 8 + dataA._sizeY * lVar11);
      if (pvVar1 != (void *)0x0) {
        operator_delete__(pvVar1);
      }
    }
    lVar11 = lVar11 + 8;
  }
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
               *)&frameBuffer);
  Imf_3_4::DeepTiledOutputFile::~DeepTiledOutputFile(&file);
  Imf_3_4::Array2D<unsigned_int>::~Array2D(&sampleCount);
  Imf_3_4::Array2D<Imath_3_2::half_*>::~Array2D(&dataA);
  Imf_3_4::Array2D<float_*>::~Array2D(&dataZ);
  Imf_3_4::Header::~Header(&header);
  return;
}

Assistant:

void
writeDeepTiledFile (
    const char filename[],
    Box2i      displayWindow,
    Box2i      dataWindow,
    int        tileSizeX,
    int        tileSizeY)
{
    int height = dataWindow.max.y - dataWindow.min.y + 1;
    int width  = dataWindow.max.x - dataWindow.min.x + 1;

    Header header (displayWindow, dataWindow);
    header.channels ().insert ("Z", Channel (FLOAT));
    header.channels ().insert ("A", Channel (HALF));
    header.setType (DEEPTILE);
    header.compression () = ZIPS_COMPRESSION;

    header.setTileDescription (
        TileDescription (tileSizeX, tileSizeY, ONE_LEVEL));

    Array2D<float*> dataZ;
    dataZ.resizeErase (height, width);

    Array2D<half*> dataA;
    dataA.resizeErase (height, width);

    Array2D<unsigned int> sampleCount;
    sampleCount.resizeErase (height, width);

    DeepTiledOutputFile file (filename, header);

    DeepFrameBuffer frameBuffer;

    frameBuffer.insertSampleCountSlice (Slice (
        UINT,
        (char*) (&sampleCount[0][0] - dataWindow.min.x - dataWindow.min.y * width),
        sizeof (unsigned int) * 1,       // xStride
        sizeof (unsigned int) * width)); // yStride

    frameBuffer.insert (
        "Z",
        DeepSlice (
            FLOAT,
            (char*) (&dataZ[0][0] - dataWindow.min.x - dataWindow.min.y * width),
            sizeof (float*) * 1,     // xStride for pointer array
            sizeof (float*) * width, // yStride for pointer array
            sizeof (float) * 1));    // stride for samples

    frameBuffer.insert (
        "A",
        DeepSlice (
            HALF,
            (char*) (&dataA[0][0] - dataWindow.min.x - dataWindow.min.y * width),
            sizeof (half*) * 1,     // xStride for pointer array
            sizeof (half*) * width, // yStride for pointer array
            sizeof (half) * 1));    // stride for samples

    file.setFrameBuffer (frameBuffer);

    for (int j = 0; j < file.numYTiles (0); j++)
    {
        for (int i = 0; i < file.numXTiles (0); i++)
        {
            // Generate data for sampleCount, dataZ and dataA.
            getSampleDataForTile (i, j, tileSizeX, tileSizeY, sampleCount, dataZ, dataA);
            file.writeTile (i, j, 0);
        }
    }
    
    for (int i = 0; i < height; i++)
    {
        for (int j = 0; j < width; j++)
        {
            delete[] dataZ[i][j];
            delete[] dataA[i][j];
        }
    }
}